

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O0

int mbedtls_dhm_parse_dhm(mbedtls_dhm_context *dhm,uchar *dhmin,size_t dhminlen)

{
  uchar *end_00;
  size_t sVar1;
  mbedtls_mpi_uint *local_78;
  undefined1 local_70 [8];
  mbedtls_mpi rec;
  mbedtls_pem_context pem;
  uchar *end;
  uchar *p;
  size_t len;
  uchar *puStack_20;
  int ret;
  size_t dhminlen_local;
  uchar *dhmin_local;
  mbedtls_dhm_context *dhm_local;
  
  puStack_20 = (uchar *)dhminlen;
  dhminlen_local = (size_t)dhmin;
  dhmin_local = (uchar *)dhm;
  mbedtls_pem_init((mbedtls_pem_context *)&rec.p);
  if ((puStack_20 == (uchar *)0x0) || (puStack_20[dhminlen_local - 1] != '\0')) {
    len._4_4_ = -0x1080;
  }
  else {
    len._4_4_ = mbedtls_pem_read_buffer
                          ((mbedtls_pem_context *)&rec.p,"-----BEGIN DH PARAMETERS-----",
                           "-----END DH PARAMETERS-----",(uchar *)dhminlen_local,(uchar *)0x0,0,
                           (size_t *)&stack0xffffffffffffffe0);
  }
  if (len._4_4_ == 0) {
    puStack_20 = pem.buf;
  }
  else if (len._4_4_ != -0x1080) goto LAB_001136a6;
  if (len._4_4_ == 0) {
    local_78 = rec.p;
  }
  else {
    local_78 = (mbedtls_mpi_uint *)dhminlen_local;
  }
  end = (uchar *)local_78;
  len._4_4_ = mbedtls_asn1_get_tag
                        (&end,(uchar *)((long)local_78 + (long)puStack_20),(size_t *)&p,0x30);
  if (len._4_4_ == 0) {
    end_00 = end + (long)p;
    len._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)(dhmin_local + 8));
    if ((len._4_4_ == 0) &&
       (len._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)(dhmin_local + 0x20)),
       len._4_4_ == 0)) {
      if (end != end_00) {
        mbedtls_mpi_init((mbedtls_mpi *)local_70);
        len._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)local_70);
        mbedtls_mpi_free((mbedtls_mpi *)local_70);
        if (len._4_4_ != 0) {
          len._4_4_ = len._4_4_ + -0x3380;
          goto LAB_001136a6;
        }
        if (end != end_00) {
          len._4_4_ = -0x33e6;
          goto LAB_001136a6;
        }
      }
      len._4_4_ = 0;
      sVar1 = mbedtls_mpi_size((mbedtls_mpi *)(dhmin_local + 8));
      *(size_t *)dhmin_local = sVar1;
    }
    else {
      len._4_4_ = len._4_4_ + -0x3380;
    }
  }
  else {
    len._4_4_ = len._4_4_ + -0x3380;
  }
LAB_001136a6:
  mbedtls_pem_free((mbedtls_pem_context *)&rec.p);
  if (len._4_4_ != 0) {
    mbedtls_dhm_free((mbedtls_dhm_context *)dhmin_local);
  }
  return len._4_4_;
}

Assistant:

int mbedtls_dhm_parse_dhm( mbedtls_dhm_context *dhm, const unsigned char *dhmin,
                   size_t dhminlen )
{
    int ret;
    size_t len;
    unsigned char *p, *end;
#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_context pem;

    mbedtls_pem_init( &pem );

    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( dhminlen == 0 || dhmin[dhminlen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN DH PARAMETERS-----",
                               "-----END DH PARAMETERS-----",
                               dhmin, NULL, 0, &dhminlen );

    if( ret == 0 )
    {
        /*
         * Was PEM encoded
         */
        dhminlen = pem.buflen;
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
        goto exit;

    p = ( ret == 0 ) ? pem.buf : (unsigned char *) dhmin;
#else
    p = (unsigned char *) dhmin;
#endif /* MBEDTLS_PEM_PARSE_C */
    end = p + dhminlen;

    /*
     *  DHParams ::= SEQUENCE {
     *      prime              INTEGER,  -- P
     *      generator          INTEGER,  -- g
     *      privateValueLength INTEGER OPTIONAL
     *  }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        ret = MBEDTLS_ERR_DHM_INVALID_FORMAT + ret;
        goto exit;
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_mpi( &p, end, &dhm->P  ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &dhm->G ) ) != 0 )
    {
        ret = MBEDTLS_ERR_DHM_INVALID_FORMAT + ret;
        goto exit;
    }

    if( p != end )
    {
        /* This might be the optional privateValueLength.
         * If so, we can cleanly discard it */
        mbedtls_mpi rec;
        mbedtls_mpi_init( &rec );
        ret = mbedtls_asn1_get_mpi( &p, end, &rec );
        mbedtls_mpi_free( &rec );
        if ( ret != 0 )
        {
            ret = MBEDTLS_ERR_DHM_INVALID_FORMAT + ret;
            goto exit;
        }
        if ( p != end )
        {
            ret = MBEDTLS_ERR_DHM_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
            goto exit;
        }
    }

    ret = 0;

    dhm->len = mbedtls_mpi_size( &dhm->P );

exit:
#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_free( &pem );
#endif
    if( ret != 0 )
        mbedtls_dhm_free( dhm );

    return( ret );
}